

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

int xmlStrVASPrintf(xmlChar **out,int maxSize,char *msg,__va_list_tag *ap)

{
  int iVar1;
  int local_70;
  uint local_6c;
  int i;
  int truncated;
  int size;
  int res;
  xmlChar *buf;
  va_list copy;
  char local_31;
  __va_list_tag *p_Stack_30;
  char empty [1];
  __va_list_tag *ap_local;
  char *msg_local;
  int maxSize_local;
  xmlChar **out_local;
  
  local_6c = 0;
  if (out == (xmlChar **)0x0) {
    out_local._4_4_ = 1;
  }
  else {
    *out = (xmlChar *)0x0;
    if (msg == (char *)0x0) {
      out_local._4_4_ = 1;
    }
    else {
      msg_local._4_4_ = maxSize;
      if (maxSize < 0x20) {
        msg_local._4_4_ = 0x20;
      }
      copy[0].overflow_arg_area = ap->reg_save_area;
      buf = *(xmlChar **)ap;
      copy[0]._0_8_ = ap->overflow_arg_area;
      p_Stack_30 = ap;
      iVar1 = vsnprintf(&local_31,1,msg,&buf);
      if (iVar1 < 1) {
        i = 0x20;
        while (_size = (xmlChar *)(*xmlMalloc)((long)i), _size != (xmlChar *)0x0) {
          copy[0].overflow_arg_area = p_Stack_30->reg_save_area;
          buf = *(xmlChar **)p_Stack_30;
          copy[0]._0_8_ = p_Stack_30->overflow_arg_area;
          iVar1 = vsnprintf((char *)_size,(long)i,msg,&buf);
          if ((-1 < iVar1) && (iVar1 < i + -1)) goto LAB_00186f6a;
          if (msg_local._4_4_ <= i) {
            local_6c = 1;
            goto LAB_00186f6a;
          }
          (*xmlFree)(_size);
          if (msg_local._4_4_ / 2 < i) {
            i = msg_local._4_4_;
          }
          else {
            i = i << 1;
          }
        }
        out_local._4_4_ = 0xffffffff;
      }
      else {
        if (msg_local._4_4_ <= iVar1) {
          i = msg_local._4_4_;
        }
        else {
          i = iVar1 + 1;
        }
        local_6c = (uint)(msg_local._4_4_ <= iVar1);
        _size = (xmlChar *)(*xmlMalloc)((long)i);
        if (_size == (xmlChar *)0x0) {
          out_local._4_4_ = 0xffffffff;
        }
        else {
          iVar1 = vsnprintf((char *)_size,(long)i,msg,p_Stack_30);
          if (iVar1 < 0) {
            (*xmlFree)(_size);
            out_local._4_4_ = 1;
          }
          else {
LAB_00186f6a:
            if (local_6c != 0) {
              local_70 = i + -1;
              do {
                if ((local_70 < 1) || (_size[local_70 + -1] < 0x80)) break;
                local_70 = local_70 + -1;
              } while (_size[local_70] < 0xc0);
              _size[local_70] = '\0';
            }
            *out = _size;
            out_local._4_4_ = local_6c;
          }
        }
      }
    }
  }
  return out_local._4_4_;
}

Assistant:

int
xmlStrVASPrintf(xmlChar **out, int maxSize, const char *msg, va_list ap) {
    char empty[1];
    va_list copy;
    xmlChar *buf;
    int res, size;
    int truncated = 0;

    if (out == NULL)
        return(1);
    *out = NULL;
    if (msg == NULL)
        return(1);
    if (maxSize < 32)
        maxSize = 32;

    va_copy(copy, ap);
    res = vsnprintf(empty, 1, msg, copy);
    va_end(copy);

    if (res > 0) {
        /* snprintf seems to work according to C99. */

        if (res < maxSize) {
            size = res + 1;
        } else {
            size = maxSize;
            truncated = 1;
        }
        buf = xmlMalloc(size);
        if (buf == NULL)
            return(-1);
        if (vsnprintf((char *) buf, size, msg, ap) < 0) {
            xmlFree(buf);
            return(1);
        }
    } else {
        /*
         * Unfortunately, older snprintf implementations don't follow the
         * C99 spec. If the output exceeds the size of the buffer, they can
         * return -1, 0 or the number of characters written instead of the
         * needed size. Older MSCVRT also won't write a terminating null
         * byte if the buffer is too small.
         *
         * If the value returned is non-negative and strictly less than
         * the buffer size (without terminating null), the result should
         * have been written completely, so we double the buffer size
         * until this condition is true. This assumes that snprintf will
         * eventually return a non-negative value. Otherwise, we will
         * allocate more and more memory until we run out.
         *
         * Note that this code path is also executed on conforming
         * platforms if the output is the empty string.
         */

        buf = NULL;
        size = 32;
        while (1) {
            buf = xmlMalloc(size);
            if (buf == NULL)
                return(-1);

            va_copy(copy, ap);
            res = vsnprintf((char *) buf, size, msg, copy);
            va_end(copy);
            if ((res >= 0) && (res < size - 1))
                break;

            if (size >= maxSize) {
                truncated = 1;
                break;
            }

            xmlFree(buf);

            if (size > maxSize / 2)
                size = maxSize;
            else
                size *= 2;
        }
    }

    /*
     * If the output was truncated, make sure that the buffer doesn't
     * end with a truncated UTF-8 sequence.
     */
    if (truncated != 0) {
        int i = size - 1;

        while (i > 0) {
            /* Break after ASCII */
            if (buf[i-1] < 0x80)
                break;
            i -= 1;
            /* Break before non-ASCII */
            if (buf[i] >= 0xc0)
                break;
        }

        buf[i] = 0;
    }

    *out = (xmlChar *) buf;
    return(truncated);
}